

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

xmlParserErrors
xmlInputSetEncodingHandler(xmlParserInputPtr input,xmlCharEncodingHandlerPtr handler)

{
  int iVar1;
  xmlCharEncError xVar2;
  size_t sStack_48;
  xmlCharEncError res;
  size_t nbchars;
  size_t processed;
  xmlBufPtr pxStack_30;
  xmlParserErrors code;
  xmlBufPtr buf;
  xmlParserInputBufferPtr in;
  xmlCharEncodingHandlerPtr handler_local;
  xmlParserInputPtr input_local;
  
  processed._4_4_ = XML_ERR_OK;
  in = (xmlParserInputBufferPtr)handler;
  handler_local = (xmlCharEncodingHandlerPtr)input;
  if ((input == (xmlParserInputPtr)0x0) || (input->buf == (xmlParserInputBufferPtr)0x0)) {
    xmlCharEncCloseFunc(handler);
    input_local._4_4_ = XML_ERR_ARGUMENT;
  }
  else {
    buf = (xmlBufPtr)input->buf;
    input->flags = input->flags | 1;
    if ((handler != (xmlCharEncodingHandlerPtr)0x0) &&
       (iVar1 = xmlStrcasecmp((xmlChar *)handler->name,"UTF-8"), iVar1 == 0)) {
      xmlCharEncCloseFunc((xmlCharEncodingHandler *)in);
      in = (xmlParserInputBufferPtr)0x0;
    }
    if ((xmlParserInputBufferPtr)buf->use == in) {
      input_local._4_4_ = XML_ERR_OK;
    }
    else if (buf->use == 0) {
      pxStack_30 = xmlBufCreate(6000);
      if (pxStack_30 == (xmlBufPtr)0x0) {
        xmlCharEncCloseFunc((xmlCharEncodingHandler *)in);
        input_local._4_4_ = XML_ERR_NO_MEMORY;
      }
      else {
        buf->use = (size_t)in;
        buf->maxSize = buf->size;
        buf->size = (size_t)pxStack_30;
        if (handler_local->inputCtxt < handler_local->ctxtDtor) {
          nbchars = (long)handler_local->outputCtxt - (long)handler_local->inputCtxt;
          xmlBufShrink((xmlBufPtr)buf->maxSize,nbchars);
          handler_local[1].input.func = handler_local[1].input.func + nbchars;
          buf[1].content = (xmlChar *)nbchars;
          if (((ulong)handler_local[1].ctxtDtor & 0x40) == 0) {
            sStack_48 = 4000;
          }
          else {
            sStack_48 = 0xffffffffffffffff;
          }
          xVar2 = xmlCharEncInput((xmlParserInputBufferPtr)buf,&stack0xffffffffffffffb8,0);
          if (xVar2 != XML_ENC_ERR_SUCCESS) {
            processed._4_4_ = *(xmlParserErrors *)&buf->field_0x34;
          }
        }
        xmlBufResetInput((xmlBufPtr)buf->size,(xmlParserInputPtr)handler_local);
        input_local._4_4_ = processed._4_4_;
      }
    }
    else {
      xmlCharEncCloseFunc((xmlCharEncodingHandler *)buf->use);
      buf->use = (size_t)in;
      input_local._4_4_ = XML_ERR_OK;
    }
  }
  return input_local._4_4_;
}

Assistant:

xmlParserErrors
xmlInputSetEncodingHandler(xmlParserInputPtr input,
                           xmlCharEncodingHandlerPtr handler) {
    xmlParserInputBufferPtr in;
    xmlBufPtr buf;
    xmlParserErrors code = XML_ERR_OK;

    if ((input == NULL) || (input->buf == NULL)) {
        xmlCharEncCloseFunc(handler);
	return(XML_ERR_ARGUMENT);
    }
    in = input->buf;

    input->flags |= XML_INPUT_HAS_ENCODING;

    /*
     * UTF-8 requires no encoding handler.
     */
    if ((handler != NULL) &&
        (xmlStrcasecmp(BAD_CAST handler->name, BAD_CAST "UTF-8") == 0)) {
        xmlCharEncCloseFunc(handler);
        handler = NULL;
    }

    if (in->encoder == handler)
        return(XML_ERR_OK);

    if (in->encoder != NULL) {
        /*
         * Switching encodings during parsing is a really bad idea,
         * but Chromium can switch between ISO-8859-1 and UTF-16 before
         * separate calls to xmlParseChunk.
         *
         * TODO: We should check whether the "raw" input buffer is empty and
         * convert the old content using the old encoder.
         */

        xmlCharEncCloseFunc(in->encoder);
        in->encoder = handler;
        return(XML_ERR_OK);
    }

    buf = xmlBufCreate(XML_IO_BUFFER_SIZE);
    if (buf == NULL) {
        xmlCharEncCloseFunc(handler);
        return(XML_ERR_NO_MEMORY);
    }

    in->encoder = handler;
    in->raw = in->buffer;
    in->buffer = buf;

    /*
     * Is there already some content down the pipe to convert ?
     */
    if (input->end > input->base) {
        size_t processed;
        size_t nbchars;
        xmlCharEncError res;

        /*
         * Shrink the current input buffer.
         * Move it as the raw buffer and create a new input buffer
         */
        processed = input->cur - input->base;
        xmlBufShrink(in->raw, processed);
        input->consumed += processed;
        in->rawconsumed = processed;

        /*
         * If we're push-parsing, we must convert the whole buffer.
         *
         * If we're pull-parsing, we could be parsing from a huge
         * memory buffer which we don't want to convert completely.
         */
        if (input->flags & XML_INPUT_PROGRESSIVE)
            nbchars = SIZE_MAX;
        else
            nbchars = 4000 /* MINLEN */;
        res = xmlCharEncInput(in, &nbchars, /* flush */ 0);
        if (res != XML_ENC_ERR_SUCCESS)
            code = in->error;
    }

    xmlBufResetInput(in->buffer, input);

    return(code);
}